

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaft.cpp
# Opt level: O1

void __thiscall chrono::ChShaft::ChShaft(ChShaft *this,ChShaft *other)

{
  ChPhysicsItem::ChPhysicsItem(&this->super_ChPhysicsItem,&other->super_ChPhysicsItem);
  (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChShaft_00b49cc0;
  (this->super_ChLoadable)._vptr_ChLoadable = (_func_int **)&PTR__ChShaft_00b49f08;
  ChVariables::ChVariables(&(this->variables).super_ChVariables,1);
  (this->variables).super_ChVariables._vptr_ChVariables = (_func_int **)&PTR__ChVariables_00b63a48;
  (this->variables).m_shaft = (ChShaft *)0x0;
  (this->variables).m_inertia = 1.0;
  (this->variables).m_inv_inertia = 1.0;
  this->torque = other->torque;
  (this->super_ChPhysicsItem).system = (other->super_ChPhysicsItem).system;
  this->pos = other->pos;
  this->pos_dt = other->pos_dt;
  this->pos_dtdt = other->pos_dtdt;
  this->inertia = other->inertia;
  this->fixed = other->fixed;
  this->sleeping = other->sleeping;
  this->limitspeed = other->limitspeed;
  ChVariablesShaft::operator=(&this->variables,&other->variables);
  this->max_speed = other->max_speed;
  this->sleep_time = other->sleep_time;
  this->sleep_starttime = other->sleep_starttime;
  this->sleep_minspeed = other->sleep_minspeed;
  this->sleep_minwvel = other->sleep_minwvel;
  return;
}

Assistant:

ChShaft::ChShaft(const ChShaft& other) : ChPhysicsItem(other) {
    torque = other.torque;
    system = other.system;
    pos = other.pos;
    pos_dt = other.pos_dt;
    pos_dtdt = other.pos_dtdt;
    inertia = other.inertia;
    fixed = other.fixed;
    sleeping = other.sleeping;
    limitspeed = other.limitspeed;

    variables = other.variables;

    max_speed = other.max_speed;

    sleep_time = other.sleep_time;
    sleep_starttime = other.sleep_starttime;
    sleep_minspeed = other.sleep_minspeed;
    sleep_minwvel = other.sleep_minwvel;
}